

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

string * __thiscall AlsaBackendFactory::probe_abi_cxx11_(AlsaBackendFactory *this,BackendType type)

{
  int in_EDX;
  string *in_RDI;
  anon_class_8_1_ebf5ae38 add_device;
  string *outnames;
  snd_pcm_stream_t in_stack_000003cc;
  anon_class_8_1_ebf5ae38 in_stack_ffffffffffffff18;
  anon_class_8_1_ebf5ae38 __f;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_ffffffffffffff20;
  undefined1 *__last;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_ffffffffffffff28;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_ffffffffffffff30;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_> *this_00
  ;
  string local_80;
  string *local_60;
  DevMap *local_58;
  DevMap *local_50;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_> local_38
  ;
  string *local_20;
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)in_RDI);
  if (local_14 == 0) {
    local_20 = in_RDI;
    anon_unknown.dwarf_211787::probe_devices(in_stack_000003cc);
    this_00 = &local_38;
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    operator=(this_00,(vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                       *)in_stack_ffffffffffffff28._M_current);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    ~vector(this_00);
    local_50 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cbegin((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                         *)in_stack_ffffffffffffff18.outnames);
    local_58 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cend((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                       *)in_stack_ffffffffffffff18.outnames);
    local_60 = local_20;
    std::
    for_each<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,AlsaBackendFactory::probe[abi:cxx11](BackendType)::__0>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else if (local_14 == 1) {
    anon_unknown.dwarf_211787::probe_devices(in_stack_000003cc);
    __last = (anonymous_namespace)::CaptureDevices;
    __f.outnames = &local_80;
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    operator=(in_stack_ffffffffffffff30,
              (vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               *)in_stack_ffffffffffffff28._M_current);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    ~vector(in_stack_ffffffffffffff30);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cbegin((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            *)__f.outnames);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cend((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
          *)__f.outnames);
    std::
    for_each<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,AlsaBackendFactory::probe[abi:cxx11](BackendType)::__0>
              (in_stack_ffffffffffffff28,
               (__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                )__last,__f);
  }
  return in_RDI;
}

Assistant:

std::string AlsaBackendFactory::probe(BackendType type)
{
    std::string outnames;

    auto add_device = [&outnames](const DevMap &entry) -> void
    {
        /* +1 to also append the null char (to ensure a null-separated list and
         * double-null terminated list).
         */
        outnames.append(entry.name.c_str(), entry.name.length()+1);
    };
    switch(type)
    {
    case BackendType::Playback:
        PlaybackDevices = probe_devices(SND_PCM_STREAM_PLAYBACK);
        std::for_each(PlaybackDevices.cbegin(), PlaybackDevices.cend(), add_device);
        break;

    case BackendType::Capture:
        CaptureDevices = probe_devices(SND_PCM_STREAM_CAPTURE);
        std::for_each(CaptureDevices.cbegin(), CaptureDevices.cend(), add_device);
        break;
    }

    return outnames;
}